

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int fm_handler(chmgr *chmgr,uint8_t *fm,uint16_t size)

{
  ushort len_00;
  ushort uVar1;
  uint16_t uVar2;
  int *piVar3;
  uint8_t *__ptr_1;
  uint8_t *__ptr;
  uint16_t crc2;
  uint16_t crc1;
  uint16_t len;
  uint16_t size_local;
  uint8_t *fm_local;
  chmgr *chmgr_local;
  
  len_00 = *(ushort *)(fm + 1);
  if ((uint)len_00 == size - 5) {
    uVar1 = *(ushort *)(fm + (long)(int)(uint)len_00 + 3);
    uVar2 = calc_crc(fm,len_00 + 3);
    if (uVar1 == uVar2) {
      chmgr_handler(chmgr,*fm,len_00,fm + 3);
      chmgr->heartbeat = 0x14;
      chmgr_local._4_4_ = 0;
    }
    else {
      if ((loglevel & 1U) != 0) {
        syslog(3,"crc{%04x, %04x} does not match\n",(ulong)uVar1,(ulong)uVar2);
      }
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      chmgr_local._4_4_ = -1;
    }
  }
  else {
    if ((loglevel & 1U) != 0) {
      syslog(3,"The data length does not match len = %d, size = %d\n",(ulong)len_00,(ulong)size);
    }
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    chmgr_local._4_4_ = -1;
  }
  return chmgr_local._4_4_;
}

Assistant:

static int fm_handler(struct chmgr *chmgr, const uint8_t *fm, uint16_t size)
{
    uint16_t len;
    uint16_t crc1 = 0, crc2 = 0;
    len = STREAM_TO_U16(fm + 1);
    if(len != size - 5) {
        LOGE("The data length does not match len = %d, size = %d\n", len, size);
        errno = EINVAL;
        return -1;
    }

    crc1 = STREAM_TO_U16(fm + FM_HDR_SIZE + len);
    crc2 = calc_crc(fm, FM_HDR_SIZE + len);
    if(crc1 !=  crc2) {
        LOGE("crc{%04x, %04x} does not match\n", crc1, crc2);
        errno = EINVAL;
        return -1;
    }

    chmgr_handler(chmgr, fm[0], len, fm + FM_HDR_SIZE);
    chmgr->heartbeat = 20;
    return 0;
}